

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O2

int rnndec_varmatch(rnndeccontext *ctx,rnnvarinfo *vi)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  if (vi->dead == 0) {
    iVar4 = 1;
    for (lVar5 = 0; lVar5 < vi->varsetsnum; lVar5 = lVar5 + 1) {
      uVar1 = ctx->varsnum;
      uVar2 = 0;
      if (0 < (int)uVar1) {
        uVar2 = (ulong)uVar1;
      }
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        if (vi->varsets[lVar5]->venum == ctx->vars[uVar3]->en) {
          uVar2 = uVar3 & 0xffffffff;
          break;
        }
      }
      if ((uint)uVar2 == uVar1) {
        fprintf(_stderr,"I don\'t know which %s variant to use!\n",vi->varsets[lVar5]->venum->name);
      }
      else if (vi->varsets[lVar5]->variants[ctx->vars[uVar2]->variant] == 0) goto LAB_001066fe;
    }
  }
  else {
LAB_001066fe:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int rnndec_varmatch(struct rnndeccontext *ctx, struct rnnvarinfo *vi) {
	if (vi->dead)
		return 0;
	int i;
	for (i = 0; i < vi->varsetsnum; i++) {
		int j;
		for (j = 0; j < ctx->varsnum; j++)
			if (vi->varsets[i]->venum == ctx->vars[j]->en)
				break;
		if (j == ctx->varsnum) {
			fprintf (stderr, "I don't know which %s variant to use!\n", vi->varsets[i]->venum->name);
		} else {
			if (!vi->varsets[i]->variants[ctx->vars[j]->variant])
				return 0;
		}
	}
	return 1;
}